

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O3

void __thiscall NaControlLaw::Load(NaControlLaw *this,NaDataStream *ds)

{
  int *piVar1;
  NaControlLawSource NVar2;
  int iVar3;
  NaControlLawItem *this_00;
  item *piVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *__dest;
  item **ppiVar6;
  uint uVar7;
  bool bVar8;
  int nItems;
  char szBuf [1024];
  int local_43c;
  char local_438 [1032];
  
  uVar7 = 0;
  NaDataStream::GetF(ds,"%s",local_438);
  NVar2 = StrToSourceIO(local_438);
  this->source = NVar2;
  NaDataStream::GetF(ds,"%u",&local_43c);
  NaDynAr<NaControlLawItem>::clean(&this->items);
  if (0 < local_43c) {
    do {
      this_00 = (NaControlLawItem *)operator_new(0x40);
      NaControlLawItem::NaControlLawItem(this_00);
      piVar4 = (item *)operator_new(0x10);
      piVar4->pData = this_00;
      piVar4->pNext = (item *)0x0;
      bVar8 = (this->items).pHead != (item *)0x0;
      ppiVar6 = &((this->items).pTail)->pNext;
      if (!bVar8) {
        ppiVar6 = &(this->items).pTail;
      }
      *ppiVar6 = piVar4;
      (&(this->items).pHead)[bVar8] = piVar4;
      piVar1 = &(this->items).nItems;
      *piVar1 = *piVar1 + 1;
      iVar3 = (*(this->items)._vptr_NaDynAr[0xf])(&this->items,(ulong)uVar7);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                ((long *)CONCAT44(extraout_var,iVar3),ds);
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < local_43c);
  }
  NaDataStream::GetF(ds,"%s",local_438);
  sVar5 = strlen(local_438);
  __dest = (char *)operator_new__(sVar5 + 1);
  this->filepath = __dest;
  strcpy(__dest,local_438);
  this->dataio = (NaDataFile *)0x0;
  NaDataStream::GetF(ds,"%lg",&this->start_value);
  NaLinearNoiseGen::Load(&this->lin_rand,ds);
  return;
}

Assistant:

void    NaControlLaw::Load (NaDataStream& ds)
{
    char    szBuf[1024];

    ds.GetF("%s", szBuf);
    source = StrToSourceIO(szBuf);

    // clsDescription
    int    nItems, i;
    ds.GetF("%u", &nItems);
    items.clean();
    for(i = 0; i < nItems; ++i){
        items.addh(new NaControlLawItem());
        items[i].Load(ds);
    }

    // clsFromFile
    ds.GetF("%s", szBuf);
    filepath = new char[strlen(szBuf) + 1];
    strcpy(filepath, szBuf);
    dataio = NULL;

    // clsManual
    ds.GetF("%lg", &start_value);

    // clsRandom
    lin_rand.Load(ds);
}